

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operators.hpp
# Opt level: O3

string * __thiscall
viennamath::op_unary<viennamath::op_gradient<double>,viennamath::rt_expression_interface<double>>::
str_abi_cxx11_(op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_>
               *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  *(undefined4 *)&in_RDI->field_2 = 0x64617267;
  in_RDI->_M_string_length = 4;
  (in_RDI->field_2)._M_local_buf[4] = '\0';
  return in_RDI;
}

Assistant:

std::string str() const { return unary_op_.str(); }